

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O3

void __thiscall
vkt::QueryPool::anon_unknown_0::
QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderTestInstance>
::initPrograms(QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderTestInstance>
               *this,SourceCollections *sourceCollections)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  char *pcVar3;
  size_t sVar4;
  ProgramSources *pPVar5;
  ostream *poVar6;
  VkPrimitiveTopology *inputType;
  VkPrimitiveTopology *outputType;
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderTestInstance>
  *pQVar7;
  long lVar8;
  ostringstream source;
  ostringstream source_te;
  undefined1 auStack_398 [8];
  string local_390;
  undefined1 local_370 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderTestInstance>
  *local_348;
  long local_340 [14];
  ios_base local_2d0 [264];
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)auStack_398 + (int)*(undefined8 *)(local_340[0] + -0x18) + 0x58);
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_340,"layout(location = 0) in highp vec4 in_position;\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_340,"layout(location = 1) in vec4 in_color;\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_340,"layout(location = 0) out vec4 out_color;\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_340,"\tgl_Position = in_position;\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_340,"\tout_color = in_color;\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"}\n",2);
  local_370._0_8_ = &local_360;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"vertex","");
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,(string *)local_370);
  local_348 = this;
  std::__cxx11::stringbuf::str();
  local_1a8._0_4_ = 0;
  local_1a8._8_8_ = local_198[0]._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_1a8 + 8),local_390._M_dataplus._M_p,
             local_390._M_dataplus._M_p + local_390._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar5->sources + (uint)local_1a8._0_4_,(value_type *)(local_1a8 + 8));
  pQVar7 = local_348;
  if ((char *)local_1a8._8_8_ != local_198[0]._M_local_buf + 8) {
    operator_delete((void *)local_1a8._8_8_,local_198[0]._8_8_ + 1);
  }
  paVar1 = &local_390.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar1) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._0_8_ != &local_360) {
    operator_delete((void *)local_370._0_8_,local_360._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340);
  std::ios_base::~ios_base(local_2d0);
  uVar2 = (pQVar7->m_parametersGraphic).queryStatisticFlags;
  if ((uVar2 & 0x300) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340);
    pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)auStack_398 + (int)*(undefined8 *)(local_340[0] + -0x18) + 0x58);
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar3,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"#extension GL_EXT_tessellation_shader : require\n",0x30);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"layout(vertices = 4) out;\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"layout(location = 0) in vec4 in_color[];\n",0x29);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"layout(location = 0) out vec4 out_color[];\n",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"\tif( gl_InvocationID == 0 )\n",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"\t{\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"\t\tgl_TessLevelInner[0] = 4.0f;\n",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"\t\tgl_TessLevelInner[1] = 4.0f;\n",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"\t\tgl_TessLevelOuter[0] = 4.0f;\n",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"\t\tgl_TessLevelOuter[1] = 4.0f;\n",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"\t\tgl_TessLevelOuter[2] = 4.0f;\n",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"\t\tgl_TessLevelOuter[3] = 4.0f;\n",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"\t}\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"\tout_color[gl_InvocationID] = in_color[gl_InvocationID];\n",
               0x39);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,
               "\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n",0x4b)
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"}\n",2);
    local_370._0_8_ = &local_360;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"tessellation_control","");
    pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&sourceCollections->glslSources,(string *)local_370);
    std::__cxx11::stringbuf::str();
    local_1a8._0_4_ = 3;
    local_1a8._8_8_ = local_198[0]._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_1a8 + 8),local_390._M_dataplus._M_p,
               local_390._M_dataplus._M_p + local_390._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar5->sources + (uint)local_1a8._0_4_,(value_type *)(local_1a8 + 8));
    if ((char *)local_1a8._8_8_ != local_198[0]._M_local_buf + 8) {
      operator_delete((void *)local_1a8._8_8_,local_198[0]._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != paVar1) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._0_8_ != &local_360) {
      operator_delete((void *)local_370._0_8_,local_360._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)auStack_398 +
                      (int)*(undefined8 *)(CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + -0x18) +
                      0x1f0);
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"#extension GL_EXT_tessellation_shader : require\n",0x30);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout( quads, equal_spacing, ccw ) in;\n",0x28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 0) in vec4 in_color[];\n",0x29);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 0) out vec4 out_color;\n",0x29);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tconst float u = gl_TessCoord.x;\n",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tconst float v = gl_TessCoord.y;\n",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tconst float w = gl_TessCoord.z;\n",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "\tgl_Position = (1 - u) * (1 - v) * gl_in[0].gl_Position +(1 - u) * v * gl_in[1].gl_Position + u * (1 - v) * gl_in[2].gl_Position + u * v * gl_in[3].gl_Position;\n"
               ,0xa1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tout_color = in_color[0];\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
    local_390._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_390,"tessellation_evaluation","");
    pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&sourceCollections->glslSources,&local_390);
    std::__cxx11::stringbuf::str();
    local_370._0_4_ = 4;
    local_370._8_8_ = local_360._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_370 + 8),local_1c8,local_1c0 + (long)local_1c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar5->sources + (local_370._0_8_ & 0xffffffff),(value_type *)(local_370 + 8));
    pQVar7 = local_348;
    if ((char *)local_370._8_8_ != local_360._M_local_buf + 8) {
      operator_delete((void *)local_370._8_8_,local_360._8_8_ + 1);
    }
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != paVar1) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340);
    std::ios_base::~ios_base(local_2d0);
    uVar2 = (pQVar7->m_parametersGraphic).queryStatisticFlags;
  }
  if ((uVar2 & 0x78) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340);
    pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)auStack_398 + (int)*(undefined8 *)(local_340[0] + -0x18) + 0x58);
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar3,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"layout(",7);
    QueryPool::(anonymous_namespace)::inputTypeToGLString_abi_cxx11_
              ((string *)local_1a8,
               (_anonymous_namespace_ *)(ulong)(pQVar7->m_parametersGraphic).primitiveTopology,
               inputType);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_340,(char *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_),
                        local_1a8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") in;\n",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"layout(",7);
    QueryPool::(anonymous_namespace)::outputTypeToGLString_abi_cxx11_
              ((string *)local_370,
               (_anonymous_namespace_ *)(ulong)(pQVar7->m_parametersGraphic).primitiveTopology,
               outputType);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)local_370._0_8_,local_370._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", max_vertices = 16) out;\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"layout(location = 0) in vec4 in_color[];\n",0x29);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"layout(location = 0) out vec4 out_color;\n",0x29);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\tout_color = in_color[0];\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"\tgl_Position = gl_in[0].gl_Position;\n",0x25);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\tEmitVertex();\n",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\tEndPrimitive();\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\tout_color = in_color[0];\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"\tgl_Position = vec4(1.0, 1.0, 1.0, 1.0);\n",0x29);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\tEmitVertex();\n",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\tout_color = in_color[0];\n",0x1a);
    pcVar3 = "\tgl_Position = vec4(-1.0, -1.0, 1.0, 1.0);\n";
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"\tgl_Position = vec4(-1.0, -1.0, 1.0, 1.0);\n",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\tEmitVertex();\n",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\tEndPrimitive();\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._0_8_ != &local_360) {
      operator_delete((void *)local_370._0_8_,local_360._M_allocated_capacity + 1);
    }
    pQVar7 = local_348;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_) != local_198) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_),
                      local_198[0]._M_allocated_capacity + 1);
    }
    if ((pQVar7->m_parametersGraphic).primitiveTopology - VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST < 2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"\tout_color = in_color[0];\n",0x1a);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"\tgl_Position = gl_in[0].gl_Position;\n",0x25);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"\tEmitVertex();\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"\tout_color = in_color[0];\n",0x1a);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"\tgl_Position = gl_in[1].gl_Position;\n",0x25);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"\tEmitVertex();\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"\tout_color = in_color[0];\n",0x1a);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"\tgl_Position = gl_in[2].gl_Position;\n",0x25);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"\tEmitVertex();\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"\tout_color = in_color[0];\n",0x1a);
      lVar8 = 0x4f;
      pcVar3 = "\tgl_Position = vec4(gl_in[2].gl_Position.x, gl_in[1].gl_Position.y, 1.0, 1.0);\n";
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"\tout_color = in_color[0];\n",0x1a);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"\tgl_Position =  vec4(1.0, 1.0, 1.0, 1.0);\n",0x2a);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"\tEmitVertex();\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"\tout_color = in_color[0];\n",0x1a);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"\tgl_Position = vec4(1.0, -1.0, 1.0, 1.0);\n",0x2a);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"\tEmitVertex();\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"\tout_color = in_color[0];\n",0x1a);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"\tgl_Position = vec4(-1.0, 1.0, 1.0, 1.0);\n",0x2a);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"\tEmitVertex();\n",0xf);
      lVar8 = 0x2b;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"\tout_color = in_color[0];\n",0x1a);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar3,lVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"\tEmitVertex();\n",0xf)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"\tEndPrimitive();\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"}\n",2);
    local_370._0_8_ = &local_360;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"geometry","");
    pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&sourceCollections->glslSources,(string *)local_370);
    std::__cxx11::stringbuf::str();
    local_1a8._0_4_ = 2;
    local_1a8._8_8_ = local_198[0]._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_1a8 + 8),local_390._M_dataplus._M_p,
               local_390._M_dataplus._M_p + local_390._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar5->sources + (uint)local_1a8._0_4_,(value_type *)(local_1a8 + 8));
    if ((char *)local_1a8._8_8_ != local_198[0]._M_local_buf + 8) {
      operator_delete((void *)local_1a8._8_8_,local_198[0]._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != paVar1) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._0_8_ != &local_360) {
      operator_delete((void *)local_370._0_8_,local_360._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340);
    std::ios_base::~ios_base(local_2d0);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)auStack_398 + (int)*(undefined8 *)(local_340[0] + -0x18) + 0x58);
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_340,"layout(location = 0) in vec4 in_color;\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_340,"layout(location = 0) out vec4 out_color;\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_340,"\tout_color = in_color;\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"}\n",2);
  local_370._0_8_ = &local_360;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"fragment","");
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,(string *)local_370);
  std::__cxx11::stringbuf::str();
  local_1a8._0_4_ = 1;
  local_1a8._8_8_ = local_198[0]._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_1a8 + 8),local_390._M_dataplus._M_p,
             local_390._M_dataplus._M_p + local_390._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar5->sources + (uint)local_1a8._0_4_,(value_type *)(local_1a8 + 8));
  if ((char *)local_1a8._8_8_ != local_198[0]._M_local_buf + 8) {
    operator_delete((void *)local_1a8._8_8_,local_198[0]._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar1) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._0_8_ != &local_360) {
    operator_delete((void *)local_370._0_8_,local_360._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340);
  std::ios_base::~ios_base(local_2d0);
  return;
}

Assistant:

void initPrograms(SourceCollections& sourceCollections) const
	{
		{ // Vertex Shader
			std::ostringstream	source;
			source	<< glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450)<<"\n"
					<< "layout(location = 0) in highp vec4 in_position;\n"
					<< "layout(location = 1) in vec4 in_color;\n"
					<< "layout(location = 0) out vec4 out_color;\n"
					<< "void main (void)\n"
					<< "{\n"
					<< "	gl_Position = in_position;\n"
					<< "	out_color = in_color;\n"
					<< "}\n";
			sourceCollections.glslSources.add("vertex") << glu::VertexSource(source.str());
		}

		if (m_parametersGraphic.queryStatisticFlags & (VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_CONTROL_SHADER_PATCHES_BIT|
									VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_EVALUATION_SHADER_INVOCATIONS_BIT))
		{// Tessellation control & evaluation
			std::ostringstream source_tc;
			source_tc	<< glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
						<< "#extension GL_EXT_tessellation_shader : require\n"
						<< "layout(vertices = 4) out;\n"
						<< "layout(location = 0) in vec4 in_color[];\n"
						<< "layout(location = 0) out vec4 out_color[];\n"
						<< "\n"
						<< "void main (void)\n"
						<< "{\n"
						<< "	if( gl_InvocationID == 0 )\n"
						<< "	{\n"
						<< "		gl_TessLevelInner[0] = 4.0f;\n"
						<< "		gl_TessLevelInner[1] = 4.0f;\n"
						<< "		gl_TessLevelOuter[0] = 4.0f;\n"
						<< "		gl_TessLevelOuter[1] = 4.0f;\n"
						<< "		gl_TessLevelOuter[2] = 4.0f;\n"
						<< "		gl_TessLevelOuter[3] = 4.0f;\n"
						<< "	}\n"
						<< "	out_color[gl_InvocationID] = in_color[gl_InvocationID];\n"
						<< "	gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
						<< "}\n";
			sourceCollections.glslSources.add("tessellation_control") << glu::TessellationControlSource(source_tc.str());

			std::ostringstream source_te;
			source_te	<< glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
						<< "#extension GL_EXT_tessellation_shader : require\n"
						<< "layout( quads, equal_spacing, ccw ) in;\n"
						<< "layout(location = 0) in vec4 in_color[];\n"
						<< "layout(location = 0) out vec4 out_color;\n"
						<< "void main (void)\n"
						<< "{\n"
						<< "	const float u = gl_TessCoord.x;\n"
						<< "	const float v = gl_TessCoord.y;\n"
						<< "	const float w = gl_TessCoord.z;\n"
						<< "	gl_Position = (1 - u) * (1 - v) * gl_in[0].gl_Position +(1 - u) * v * gl_in[1].gl_Position + u * (1 - v) * gl_in[2].gl_Position + u * v * gl_in[3].gl_Position;\n"
						<< "	out_color = in_color[0];\n"
						<< "}\n";
			sourceCollections.glslSources.add("tessellation_evaluation") << glu::TessellationEvaluationSource(source_te.str());
		}

		if(m_parametersGraphic.queryStatisticFlags & (VK_QUERY_PIPELINE_STATISTIC_CLIPPING_INVOCATIONS_BIT | VK_QUERY_PIPELINE_STATISTIC_CLIPPING_PRIMITIVES_BIT |
									VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_INVOCATIONS_BIT | VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_PRIMITIVES_BIT))
		{ // Geometry Shader
			std::ostringstream	source;
			source	<< glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450)<<"\n"
					<< "layout("<<inputTypeToGLString(m_parametersGraphic.primitiveTopology)<<") in;\n"
					<< "layout("<<outputTypeToGLString (m_parametersGraphic.primitiveTopology)<<", max_vertices = 16) out;\n"
					<< "layout(location = 0) in vec4 in_color[];\n"
					<< "layout(location = 0) out vec4 out_color;\n"
					<< "void main (void)\n"
					<< "{\n"
					<< "	out_color = in_color[0];\n"
					<< "	gl_Position = gl_in[0].gl_Position;\n"
					<< "	EmitVertex();\n"
					<< "	EndPrimitive();\n"
					<< "\n"
					<< "	out_color = in_color[0];\n"
					<< "	gl_Position = vec4(1.0, 1.0, 1.0, 1.0);\n"
					<< "	EmitVertex();\n"
					<< "	out_color = in_color[0];\n"
					<< "	gl_Position = vec4(-1.0, -1.0, 1.0, 1.0);\n"
					<< "	EmitVertex();\n"
					<< "	EndPrimitive();\n"
					<< "\n";
			if (m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP ||
				m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST)
			{
				source	<< "\n"
						<< "	out_color = in_color[0];\n"
						<< "	gl_Position = gl_in[0].gl_Position;\n"
						<< "	EmitVertex();\n"
						<< "	out_color = in_color[0];\n"
						<< "	gl_Position = gl_in[1].gl_Position;\n"
						<< "	EmitVertex();\n"
						<< "	out_color = in_color[0];\n"
						<< "	gl_Position = gl_in[2].gl_Position;\n"
						<< "	EmitVertex();\n"
						<< "	out_color = in_color[0];\n"
						<< "	gl_Position = vec4(gl_in[2].gl_Position.x, gl_in[1].gl_Position.y, 1.0, 1.0);\n"
						<< "	EmitVertex();\n"
						<< "	EndPrimitive();\n";
			}
			else
			{
				source	<< "	out_color = in_color[0];\n"
						<< "	gl_Position =  vec4(1.0, 1.0, 1.0, 1.0);\n"
						<< "	EmitVertex();\n"
						<< "	out_color = in_color[0];\n"
						<< "	gl_Position = vec4(1.0, -1.0, 1.0, 1.0);\n"
						<< "	EmitVertex();\n"
						<< "	out_color = in_color[0];\n"
						<< "	gl_Position = vec4(-1.0, 1.0, 1.0, 1.0);\n"
						<< "	EmitVertex();\n"
						<< "	out_color = in_color[0];\n"
						<< "	gl_Position = vec4(-1.0, -1.0, 1.0, 1.0);\n"
						<< "	EmitVertex();\n"
						<< "	EndPrimitive();\n";
			}
			source	<< "}\n";
			sourceCollections.glslSources.add("geometry") << glu::GeometrySource(source.str());
		}

		{ // Fragment Shader
			std::ostringstream	source;
			source	<< glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450)<<"\n"
					<< "layout(location = 0) in vec4 in_color;\n"
					<< "layout(location = 0) out vec4 out_color;\n"
					<< "void main()\n"
					<<"{\n"
					<< "	out_color = in_color;\n"
					<< "}\n";
			sourceCollections.glslSources.add("fragment") << glu::FragmentSource(source.str());
		}
	}